

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O1

void __thiscall Imf_3_2::anon_unknown_6::TileBufferTask::execute(TileBufferTask *this)

{
  pointer pTVar1;
  TileBuffer *pTVar2;
  size_t xStride;
  uint *puVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  Data *pDVar7;
  pointer pTVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  Box2i tileRange;
  char *readPtr;
  char *writePtr;
  char *compPtr;
  char *readPtr_1;
  int local_38;
  
  pTVar2 = this->_tileBuffer;
  writePtr = (char *)(pTVar2->sampleCount)._sizeY;
  pDVar7 = this->_ofd;
  Imf_3_2::dataWindowForTile
            ((Imf_3_2 *)&tileRange,&pDVar7->tileDesc,pDVar7->minX,pDVar7->maxX,pDVar7->minY,
             pDVar7->maxY,(int)pTVar2->dataSize,*(int *)((long)&pTVar2->dataSize + 4),
             (int)pTVar2->uncompressedDataSize,*(int *)((long)&pTVar2->uncompressedDataSize + 4));
  lVar13 = (long)tileRange.max.x;
  lVar11 = (long)tileRange.min.x;
  iVar9 = (int)(lVar13 - lVar11) + 1;
  iVar10 = tileRange.max.y - tileRange.min.y;
  if (tileRange.min.y <= tileRange.max.y) {
    iVar6 = tileRange.min.y;
    do {
      pDVar7 = this->_ofd;
      pTVar8 = (pDVar7->slices).
               super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pDVar7->slices).
          super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish != pTVar8) {
        uVar14 = 0;
        uVar12 = 1;
        do {
          pTVar1 = pTVar8 + uVar14;
          if (pTVar8[uVar14].zero == true) {
            fillChannelWithZeroes(&writePtr,pDVar7->format,pTVar1->type,(long)iVar9);
          }
          else {
            xStride = pTVar1->xStride;
            readPtr = pTVar1->base +
                      (long)(iVar6 - tileRange.min.y * pTVar1->yTileCoords) * pTVar1->yStride +
                      (long)((1 - pTVar1->xTileCoords) * tileRange.min.x) * xStride;
            copyFromFrameBuffer(&writePtr,&readPtr,readPtr + xStride * (lVar13 - lVar11),xStride,
                                pDVar7->format,pTVar1->type);
          }
          pDVar7 = this->_ofd;
          pTVar8 = (pDVar7->slices).
                   super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar14 = ((long)(pDVar7->slices).
                          super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8 >> 4) *
                   -0x5555555555555555;
          bVar15 = uVar12 <= uVar14;
          lVar5 = uVar14 - uVar12;
          uVar14 = uVar12;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (bVar15 && lVar5 != 0);
      }
      bVar15 = iVar6 < tileRange.max.y;
      iVar6 = iVar6 + 1;
    } while (bVar15);
  }
  pTVar2 = this->_tileBuffer;
  puVar3 = (uint *)(pTVar2->sampleCount)._sizeY;
  plVar4 = (long *)pTVar2->buffer;
  *(int *)&pTVar2->uncompressedData = (int)writePtr - (int)puVar3;
  (pTVar2->sampleCount)._data = puVar3;
  if (plVar4 != (long *)0x0) {
    local_38 = tileRange.max.x;
    iVar6 = (**(code **)(*plVar4 + 0x28))();
    pTVar2 = this->_tileBuffer;
    if (iVar6 < *(int *)&pTVar2->uncompressedData) {
      *(int *)&pTVar2->uncompressedData = iVar6;
      (pTVar2->sampleCount)._data = (uint *)compPtr;
    }
    else {
      pDVar7 = this->_ofd;
      if (pDVar7->format == NATIVE) {
        readPtr = (char *)(pTVar2->sampleCount)._sizeY;
        if (-1 < iVar10) {
          readPtr_1 = readPtr;
          iVar6 = 0;
          do {
            pTVar8 = (pDVar7->slices).
                     super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((pDVar7->slices).
                super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish != pTVar8) {
              uVar14 = 0;
              uVar12 = 1;
              do {
                convertInPlace(&readPtr,&readPtr_1,pTVar8[uVar14].type,(long)iVar9);
                pTVar8 = (pDVar7->slices).
                         super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar14 = ((long)(pDVar7->slices).
                                super__Vector_base<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8 >> 4) *
                         -0x5555555555555555;
                bVar15 = uVar12 <= uVar14;
                lVar11 = uVar14 - uVar12;
                uVar14 = uVar12;
                uVar12 = (ulong)((int)uVar12 + 1);
              } while (bVar15 && lVar11 != 0);
            }
            bVar15 = iVar6 != iVar10;
            iVar6 = iVar6 + 1;
          } while (bVar15);
        }
      }
    }
  }
  return;
}

Assistant:

void
TileBufferTask::execute ()
{
    try
    {
        //
        // Calculate information about the tile
        //

        Box2i tileRange = OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForTile (
            _ifd->tileDesc,
            _ifd->minX,
            _ifd->maxX,
            _ifd->minY,
            _ifd->maxY,
            _tileBuffer->dx,
            _tileBuffer->dy,
            _tileBuffer->lx,
            _tileBuffer->ly);

        //
        // Get the size of the tile.
        //

        Array<unsigned int> numPixelsPerScanLine;
        numPixelsPerScanLine.resizeErase (
            tileRange.max.y - tileRange.min.y + 1);

        int sizeOfTile          = 0;
        int maxBytesPerTileLine = 0;

        for (int y = tileRange.min.y; y <= tileRange.max.y; y++)
        {
            numPixelsPerScanLine[y - tileRange.min.y] = 0;

            int bytesPerLine = 0;

            for (int x = tileRange.min.x; x <= tileRange.max.x; x++)
            {
                int xOffset = _ifd->sampleCountXTileCoords * tileRange.min.x;
                int yOffset = _ifd->sampleCountYTileCoords * tileRange.min.y;

                int count = _ifd->getSampleCount (x - xOffset, y - yOffset);
                for (unsigned int c = 0; c < _ifd->slices.size (); ++c)
                {
                    // This slice does not exist in the file.
                    if (!_ifd->slices[c]->fill)
                    {
                        sizeOfTile +=
                            count * pixelTypeSize (_ifd->slices[c]->typeInFile);
                        bytesPerLine +=
                            count * pixelTypeSize (_ifd->slices[c]->typeInFile);
                    }
                }
                numPixelsPerScanLine[y - tileRange.min.y] += count;
            }

            if (bytesPerLine > maxBytesPerTileLine)
                maxBytesPerTileLine = bytesPerLine;
        }

        // (TODO) don't do this every time.
        if (_tileBuffer->compressor != 0) delete _tileBuffer->compressor;
        _tileBuffer->compressor = newTileCompressor (
            _ifd->header.compression (),
            maxBytesPerTileLine,
            _ifd->tileDesc.ySize,
            _ifd->header);

        //
        // Uncompress the data, if necessary
        //

        if (_tileBuffer->compressor &&
            _tileBuffer->dataSize < static_cast<uint64_t> (sizeOfTile))
        {
            _tileBuffer->format = _tileBuffer->compressor->format ();

            _tileBuffer->dataSize = _tileBuffer->compressor->uncompressTile (
                _tileBuffer->buffer,
                static_cast<int> (_tileBuffer->dataSize),
                tileRange,
                _tileBuffer->uncompressedData);
        }
        else
        {
            //
            // If the line is uncompressed, it's in XDR format,
            // regardless of the compressor's output format.
            //

            _tileBuffer->format           = Compressor::XDR;
            _tileBuffer->uncompressedData = _tileBuffer->buffer;
        }

        //
        // sanity check data size: the uncompressed data should be exactly
        // 'sizeOfTile' (if it's less, the file is corrupt and there'll be a buffer overrun)
        //
        if (_tileBuffer->dataSize != static_cast<uint64_t> (sizeOfTile))
        {
            THROW (
                IEX_NAMESPACE::InputExc,
                "size mismatch when reading deep tile: expected "
                    << sizeOfTile << "bytes of uncompressed data but got "
                    << _tileBuffer->dataSize);
        }

        //
        // Convert the tile of pixel data back from the machine-independent
        // representation, and store the result in the frame buffer.
        //

        const char* readPtr = _tileBuffer->uncompressedData;
        // points to where we
        // read from in the
        // tile block

        //
        // Iterate over the scan lines in the tile.
        //

        for (int y = tileRange.min.y; y <= tileRange.max.y; ++y)
        {
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ifd->slices.size (); ++i)
            {
                TInSliceInfo& slice = *_ifd->slices[i];

                //
                // These offsets are used to facilitate both
                // absolute and tile-relative pixel coordinates.
                //

                int xOffsetForData = (slice.xTileCoords == 0) ? 0
                                                              : tileRange.min.x;
                int yOffsetForData = (slice.yTileCoords == 0) ? 0
                                                              : tileRange.min.y;
                int xOffsetForSampleCount =
                    (_ifd->sampleCountXTileCoords == 0) ? 0 : tileRange.min.x;
                int yOffsetForSampleCount =
                    (_ifd->sampleCountYTileCoords == 0) ? 0 : tileRange.min.y;

                //
                // Fill the frame buffer with pixel data.
                //

                if (slice.skip)
                {
                    //
                    // The file contains data for this channel, but
                    // the frame buffer contains no slice for this channel.
                    //

                    skipChannel (
                        readPtr,
                        slice.typeInFile,
                        numPixelsPerScanLine[y - tileRange.min.y]);
                }
                else
                {
                    //
                    // The frame buffer contains a slice for this channel.
                    //

                    copyIntoDeepFrameBuffer (
                        readPtr,
                        slice.pointerArrayBase,
                        _ifd->sampleCountSliceBase,
                        _ifd->sampleCountXStride,
                        _ifd->sampleCountYStride,
                        y,
                        tileRange.min.x,
                        tileRange.max.x,
                        xOffsetForSampleCount,
                        yOffsetForSampleCount,
                        xOffsetForData,
                        yOffsetForData,
                        slice.sampleStride,
                        slice.xStride,
                        slice.yStride,
                        slice.fill,
                        slice.fillValue,
                        _tileBuffer->format,
                        slice.typeInFrameBuffer,
                        slice.typeInFile);
                }
            }
        }
    }
    catch (std::exception& e)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = e.what ();
            _tileBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = "unrecognized exception";
            _tileBuffer->hasException = true;
        }
    }
}